

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O0

bool tcu::anon_unknown_3::
     verifyTriangleGroupInterpolationWithInterpolator<tcu::(anonymous_namespace)::MultisampleLineInterpolator>
               (Surface *surface,TriangleSceneSpec *scene,RasterizationArguments *args,TestLog *log,
               MultisampleLineInterpolator *interpolator)

{
  RGBA RVar1;
  int iVar2;
  int iVar3;
  CoverageType CVar4;
  int iVar5;
  MessageBuilder *pMVar6;
  size_type sVar7;
  const_reference pvVar8;
  const_reference pvVar9;
  const_reference pvVar10;
  TestLog *pTVar11;
  bool bVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  allocator<char> local_1541;
  string local_1540;
  allocator<char> local_1519;
  string local_1518;
  LogImage local_14f8;
  allocator<char> local_1461;
  string local_1460;
  allocator<char> local_1439;
  string local_1438;
  LogImageSet local_1418;
  MessageBuilder local_13d8;
  undefined4 local_1258;
  allocator<char> local_1251;
  string local_1250;
  allocator<char> local_1229;
  string local_1228;
  LogImage local_1208;
  allocator<char> local_1171;
  string local_1170;
  allocator<char> local_1149;
  string local_1148;
  LogImage local_1128;
  allocator<char> local_1091;
  string local_1090;
  allocator<char> local_1069;
  string local_1068;
  LogImageSet local_1048;
  MessageBuilder local_1008;
  int local_e84;
  MessageBuilder local_e80;
  int local_d00;
  Vector<float,_3> local_cfc;
  Vector<float,_3> local_cf0;
  Vector<float,_3> local_ce4;
  Vector<float,_3> local_cd8;
  Vector<float,_3> local_ccc;
  Vector<float,_3> local_cc0;
  Vector<float,_3> local_cb4;
  Vector<float,_3> local_ca8;
  Vector<int,_3> local_c9c;
  Vector<float,_3> local_c90;
  Vector<float,_3> local_c84;
  Vector<float,_3> local_c78;
  Vector<float,_3> local_c6c;
  Vector<float,_3> local_c60;
  Vector<int,_3> local_c54;
  Vector<float,_3> local_c48;
  Vector<float,_3> local_c3c;
  Vector<float,_3> local_c30;
  Vector<int,_3> local_c24;
  Vector<int,_3> local_c18;
  Vector<int,_3> local_c0c;
  Vector<int,_3> local_c00;
  Vector<int,_3> local_bf4;
  Vector<int,_3> local_be8;
  Vector<int,_3> local_bdc;
  Vector<int,_3> local_bd0;
  Vector<int,_3> local_bc4;
  MessageBuilder local_bb8;
  undefined1 local_a38 [8];
  IVec3 pixelNativeColor_1;
  IVec3 colorMax;
  IVec3 colorMin;
  Vec3 colorMaxF;
  Vec3 colorMinF;
  IVec3 formatLimit;
  undefined1 local_9d4 [8];
  Vec3 valueRangeMax;
  undefined1 local_9ac [8];
  Vec3 valueRangeMin;
  int thresholdBlue;
  int thresholdGreen;
  int thresholdRed;
  undefined4 local_810;
  undefined1 local_80c [4];
  int threshold;
  IVec3 pixelNativeColor;
  tcu local_7f0 [8];
  float local_7e8 [2];
  tcu local_7e0 [16];
  Vector<float,_4> local_7d0;
  Vector<float,_4> local_7c0;
  Vector<float,_4> local_7b0;
  Vector<float,_4> local_7a0;
  undefined1 local_790 [8];
  Vec4 fragmentColorMin;
  Vector<float,_4> local_770;
  Vector<float,_4> local_760;
  Vector<float,_4> local_750;
  undefined1 local_740 [8];
  Vec4 fragmentColorMax;
  Vector<int,_2> local_728;
  undefined1 local_720 [8];
  InterpolationRange weights;
  int local_6fc;
  CoverageType coverage;
  int triNdx;
  Vec4 colorStackMax;
  Vec4 colorStackMin;
  int local_6cc;
  int stackSize;
  int iStack_6c0;
  bool stackBottomFound;
  RGBA color;
  int x;
  int y;
  MessageBuilder local_538;
  MessageBuilder local_3b8;
  MessageBuilder local_238;
  Vector<float,_4> local_b4;
  PixelBufferAccess local_98;
  undefined1 local_70 [8];
  Surface errorMask;
  int subPixelBits;
  int invalidPixels;
  int errorCount;
  int errorFloodThreshold;
  IVec2 viewportSize;
  bool multisampled;
  RGBA invalidPixelColor;
  MultisampleLineInterpolator *interpolator_local;
  TestLog *log_local;
  RasterizationArguments *args_local;
  TriangleSceneSpec *scene_local;
  Surface *surface_local;
  
  RGBA::RGBA((RGBA *)(viewportSize.m_data + 1),0xff,0,0,0xff);
  viewportSize.m_data[0]._3_1_ = args->numSamples != 0;
  iVar2 = Surface::getWidth(surface);
  iVar3 = Surface::getHeight(surface);
  Vector<int,_2>::Vector((Vector<int,_2> *)&errorCount,iVar2,iVar3);
  subPixelBits = 0;
  errorMask.m_pixels.m_cap._4_4_ = 0;
  errorMask.m_pixels.m_cap._0_4_ = args->subpixelBits;
  iVar2 = Surface::getWidth(surface);
  iVar3 = Surface::getHeight(surface);
  Surface::Surface((Surface *)local_70,iVar2,iVar3);
  Surface::getAccess(&local_98,(Surface *)local_70);
  Vector<float,_4>::Vector(&local_b4,0.0,0.0,0.0,1.0);
  tcu::clear(&local_98,&local_b4);
  TestLog::operator<<(&local_238,log,(BeginMessageToken *)&TestLog::Message);
  pMVar6 = MessageBuilder::operator<<
                     (&local_238,
                      (char (*) [53])"Verifying rasterization result. Native format is RGB");
  pMVar6 = MessageBuilder::operator<<(pMVar6,&args->redBits);
  pMVar6 = MessageBuilder::operator<<(pMVar6,&args->greenBits);
  pMVar6 = MessageBuilder::operator<<(pMVar6,&args->blueBits);
  MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&TestLog::EndMessage);
  MessageBuilder::~MessageBuilder(&local_238);
  if (((8 < args->redBits) || (8 < args->greenBits)) || (8 < args->blueBits)) {
    TestLog::operator<<(&local_3b8,log,(BeginMessageToken *)&TestLog::Message);
    pMVar6 = MessageBuilder::operator<<
                       (&local_3b8,
                        (char (*) [80])
                        "Warning! More than 8 bits in a color channel, this may produce false negatives."
                       );
    MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&TestLog::EndMessage);
    MessageBuilder::~MessageBuilder(&local_3b8);
  }
  if ((int)errorMask.m_pixels.m_cap < 0) {
    TestLog::operator<<(&local_538,log,(BeginMessageToken *)&TestLog::Message);
    pMVar6 = MessageBuilder::operator<<(&local_538,(char (*) [25])"Invalid subpixel count (");
    pMVar6 = MessageBuilder::operator<<(pMVar6,(int *)&errorMask.m_pixels.m_cap);
    pMVar6 = MessageBuilder::operator<<(pMVar6,(char (*) [14])"), assuming 0");
    MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&TestLog::EndMessage);
    MessageBuilder::~MessageBuilder(&local_538);
    errorMask.m_pixels.m_cap._0_4_ = 0;
  }
  else if (0x10 < (int)errorMask.m_pixels.m_cap) {
    TestLog::operator<<((MessageBuilder *)&x,log,(BeginMessageToken *)&TestLog::Message);
    pMVar6 = MessageBuilder::operator<<
                       ((MessageBuilder *)&x,(char (*) [36])"Subpixel count is greater than 16 (");
    pMVar6 = MessageBuilder::operator<<(pMVar6,(int *)&errorMask.m_pixels.m_cap);
    pMVar6 = MessageBuilder::operator<<
                       (pMVar6,(char (*) [93])
                               "). Checking results using less strict 16 bit requirements. This may produce false positives."
                       );
    MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&TestLog::EndMessage);
    MessageBuilder::~MessageBuilder((MessageBuilder *)&x);
    errorMask.m_pixels.m_cap._0_4_ = 0x10;
  }
  color.m_value = 0;
  do {
    RVar1.m_value = color.m_value;
    iVar2 = Surface::getHeight(surface);
    if (iVar2 <= (int)RVar1.m_value) {
      if (4 < subPixelBits) {
        TestLog::operator<<(&local_e80,log,(BeginMessageToken *)&TestLog::Message);
        pMVar6 = MessageBuilder::operator<<(&local_e80,(char (*) [9])"Omitted ");
        local_e84 = subPixelBits + -4;
        pMVar6 = MessageBuilder::operator<<(pMVar6,&local_e84);
        pMVar6 = MessageBuilder::operator<<(pMVar6,(char (*) [29])" pixel error description(s).");
        MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&TestLog::EndMessage);
        MessageBuilder::~MessageBuilder(&local_e80);
      }
      bVar12 = errorMask.m_pixels.m_cap._4_4_ == 0;
      if (bVar12) {
        TestLog::operator<<(&local_13d8,log,(BeginMessageToken *)&TestLog::Message);
        pMVar6 = MessageBuilder::operator<<(&local_13d8,(char (*) [25])"No invalid pixels found.");
        MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&TestLog::EndMessage);
        MessageBuilder::~MessageBuilder(&local_13d8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1438,"Verification result",&local_1439);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1460,"Result of rendering",&local_1461);
        LogImageSet::LogImageSet(&local_1418,&local_1438,&local_1460);
        pTVar11 = TestLog::operator<<(log,&local_1418);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1518,"Result",&local_1519);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1540,"Result",&local_1541);
        LogImage::LogImage(&local_14f8,&local_1518,&local_1540,surface,
                           QP_IMAGE_COMPRESSION_MODE_BEST);
        pTVar11 = TestLog::operator<<(pTVar11,&local_14f8);
        TestLog::operator<<(pTVar11,(EndImageSetToken *)&TestLog::EndImageSet);
        LogImage::~LogImage(&local_14f8);
        std::__cxx11::string::~string((string *)&local_1540);
        std::allocator<char>::~allocator(&local_1541);
        std::__cxx11::string::~string((string *)&local_1518);
        std::allocator<char>::~allocator(&local_1519);
        LogImageSet::~LogImageSet(&local_1418);
        std::__cxx11::string::~string((string *)&local_1460);
        std::allocator<char>::~allocator(&local_1461);
        std::__cxx11::string::~string((string *)&local_1438);
        std::allocator<char>::~allocator(&local_1439);
      }
      else {
        TestLog::operator<<(&local_1008,log,(BeginMessageToken *)&TestLog::Message);
        pMVar6 = MessageBuilder::operator<<
                           (&local_1008,(int *)((long)&errorMask.m_pixels.m_cap + 4));
        pMVar6 = MessageBuilder::operator<<(pMVar6,(char (*) [25])" invalid pixel(s) found.");
        MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&TestLog::EndMessage);
        MessageBuilder::~MessageBuilder(&local_1008);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1068,"Verification result",&local_1069);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1090,"Result of rendering",&local_1091);
        LogImageSet::LogImageSet(&local_1048,&local_1068,&local_1090);
        pTVar11 = TestLog::operator<<(log,&local_1048);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1148,"Result",&local_1149);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1170,"Result",&local_1171);
        LogImage::LogImage(&local_1128,&local_1148,&local_1170,surface,
                           QP_IMAGE_COMPRESSION_MODE_BEST);
        pTVar11 = TestLog::operator<<(pTVar11,&local_1128);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1228,"ErrorMask",&local_1229);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1250,"ErrorMask",&local_1251);
        LogImage::LogImage(&local_1208,&local_1228,&local_1250,(Surface *)local_70,
                           QP_IMAGE_COMPRESSION_MODE_BEST);
        pTVar11 = TestLog::operator<<(pTVar11,&local_1208);
        TestLog::operator<<(pTVar11,(EndImageSetToken *)&TestLog::EndImageSet);
        LogImage::~LogImage(&local_1208);
        std::__cxx11::string::~string((string *)&local_1250);
        std::allocator<char>::~allocator(&local_1251);
        std::__cxx11::string::~string((string *)&local_1228);
        std::allocator<char>::~allocator(&local_1229);
        LogImage::~LogImage(&local_1128);
        std::__cxx11::string::~string((string *)&local_1170);
        std::allocator<char>::~allocator(&local_1171);
        std::__cxx11::string::~string((string *)&local_1148);
        std::allocator<char>::~allocator(&local_1149);
        LogImageSet::~LogImageSet(&local_1048);
        std::__cxx11::string::~string((string *)&local_1090);
        std::allocator<char>::~allocator(&local_1091);
        std::__cxx11::string::~string((string *)&local_1068);
        std::allocator<char>::~allocator(&local_1069);
      }
      local_1258 = 1;
      Surface::~Surface((Surface *)local_70);
      return bVar12;
    }
    for (iStack_6c0 = 0; iVar2 = iStack_6c0, iVar3 = Surface::getWidth(surface), iVar2 < iVar3;
        iStack_6c0 = iStack_6c0 + 1) {
      stackSize = (int)Surface::getPixel(surface,iStack_6c0,color.m_value);
      bVar12 = false;
      local_6cc = 0;
      Vector<float,_4>::Vector((Vector<float,_4> *)(colorStackMax.m_data + 2));
      Vector<float,_4>::Vector((Vector<float,_4> *)&coverage);
      sVar7 = std::
              vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
              ::size(&scene->triangles);
      local_6fc = (int)sVar7;
      do {
        do {
          local_6fc = local_6fc + -1;
          if (local_6fc < 0) goto LAB_0297fd9d;
          pvVar8 = std::
                   vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                   ::operator[](&scene->triangles,(long)local_6fc);
          pvVar9 = std::
                   vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                   ::operator[](&scene->triangles,(long)local_6fc);
          pvVar10 = std::
                    vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                    ::operator[](&scene->triangles,(long)local_6fc);
          Vector<int,_2>::Vector
                    ((Vector<int,_2> *)(weights.min.m_data + 1),iStack_6c0,color.m_value);
          CVar4 = calculateTriangleCoverage
                            (pvVar8->positions,pvVar9->positions + 1,pvVar10->positions + 2,
                             (IVec2 *)(weights.min.m_data + 1),(IVec2 *)&errorCount,
                             (int)errorMask.m_pixels.m_cap,(bool)(viewportSize.m_data[0]._3_1_ & 1))
          ;
        } while ((CVar4 != COVERAGE_FULL) && (CVar4 != COVERAGE_PARTIAL));
        Vector<int,_2>::Vector(&local_728,iStack_6c0,color.m_value);
        Vector<int,_2>::Vector
                  ((Vector<int,_2> *)(fragmentColorMax.m_data + 2),(Vector<int,_2> *)&errorCount);
        MultisampleLineInterpolator::interpolate
                  ((InterpolationRange *)local_720,interpolator,local_6fc,&local_728,
                   (IVec2 *)(fragmentColorMax.m_data + 2),(bool)(viewportSize.m_data[0]._3_1_ & 1),
                   (int)errorMask.m_pixels.m_cap);
        fVar13 = Vector<float,_3>::x((Vector<float,_3> *)local_720);
        fVar13 = de::clamp<float>(fVar13,0.0,1.0);
        pvVar8 = std::
                 vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                 ::operator[](&scene->triangles,(long)local_6fc);
        tcu::operator*((tcu *)&local_760,fVar13,pvVar8->colors);
        fVar13 = Vector<float,_3>::y((Vector<float,_3> *)local_720);
        fVar13 = de::clamp<float>(fVar13,0.0,1.0);
        pvVar8 = std::
                 vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                 ::operator[](&scene->triangles,(long)local_6fc);
        tcu::operator*((tcu *)&local_770,fVar13,pvVar8->colors + 1);
        tcu::operator+((tcu *)&local_750,&local_760,&local_770);
        fVar13 = Vector<float,_3>::z((Vector<float,_3> *)local_720);
        fVar13 = de::clamp<float>(fVar13,0.0,1.0);
        pvVar8 = std::
                 vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                 ::operator[](&scene->triangles,(long)local_6fc);
        tcu::operator*((tcu *)(fragmentColorMin.m_data + 2),fVar13,pvVar8->colors + 2);
        tcu::operator+((tcu *)local_740,&local_750,(Vector<float,_4> *)(fragmentColorMin.m_data + 2)
                      );
        fVar13 = Vector<float,_3>::x((Vector<float,_3> *)(weights.max.m_data + 1));
        fVar13 = de::clamp<float>(fVar13,0.0,1.0);
        pvVar8 = std::
                 vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                 ::operator[](&scene->triangles,(long)local_6fc);
        tcu::operator*((tcu *)&local_7b0,fVar13,pvVar8->colors);
        fVar13 = Vector<float,_3>::y((Vector<float,_3> *)(weights.max.m_data + 1));
        fVar13 = de::clamp<float>(fVar13,0.0,1.0);
        pvVar8 = std::
                 vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                 ::operator[](&scene->triangles,(long)local_6fc);
        tcu::operator*((tcu *)&local_7c0,fVar13,pvVar8->colors + 1);
        tcu::operator+((tcu *)&local_7a0,&local_7b0,&local_7c0);
        fVar13 = Vector<float,_3>::z((Vector<float,_3> *)(weights.max.m_data + 1));
        fVar13 = de::clamp<float>(fVar13,0.0,1.0);
        pvVar8 = std::
                 vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                 ::operator[](&scene->triangles,(long)local_6fc);
        tcu::operator*((tcu *)&local_7d0,fVar13,pvVar8->colors + 2);
        tcu::operator+((tcu *)local_790,&local_7a0,&local_7d0);
        iVar2 = local_6cc + 1;
        if (local_6cc == 0) {
          colorStackMax.m_data[2] = (float)local_790._0_4_;
          colorStackMax.m_data[3] = (float)local_790._4_4_;
          coverage = local_740._0_4_;
          triNdx = local_740._4_4_;
          colorStackMax.m_data[0] = fragmentColorMax.m_data[0];
          colorStackMax.m_data[1] = fragmentColorMax.m_data[1];
        }
        else {
          min<float,4>(local_7e0,(Vector<float,_4> *)(colorStackMax.m_data + 2),
                       (Vector<float,_4> *)local_790);
          colorStackMax.m_data._8_8_ = local_7e0._0_8_;
          max<float,4>(local_7f0,(Vector<float,_4> *)&coverage,(Vector<float,_4> *)local_740);
          _coverage = local_7f0;
          colorStackMax.m_data[0] = local_7e8[0];
          colorStackMax.m_data[1] = local_7e8[1];
        }
        local_6cc = iVar2;
      } while (CVar4 != COVERAGE_FULL);
      bVar12 = true;
LAB_0297fd9d:
      if ((local_6cc != 0) && (!bVar12)) {
        local_6cc = local_6cc + 1;
        Vector<float,_4>::Vector((Vector<float,_4> *)(pixelNativeColor.m_data + 1),0.0,0.0,0.0,1.0);
        colorStackMax.m_data[2] = (float)pixelNativeColor.m_data[1];
        colorStackMax.m_data[3] = (float)pixelNativeColor.m_data[2];
      }
      if (local_6cc == 0) {
        convertRGB8ToNativeFormat((anon_unknown_3 *)local_80c,(RGBA *)&stackSize,args);
        local_810 = 1;
        iVar2 = Vector<int,_3>::x((Vector<int,_3> *)local_80c);
        if (((1 < iVar2) || (iVar2 = Vector<int,_3>::y((Vector<int,_3> *)local_80c), 1 < iVar2)) ||
           (iVar2 = Vector<int,_3>::z((Vector<int,_3> *)local_80c), 1 < iVar2)) {
          subPixelBits = subPixelBits + 1;
          if (subPixelBits < 4) {
            TestLog::operator<<((MessageBuilder *)&thresholdRed,log,
                                (BeginMessageToken *)&TestLog::Message);
            pMVar6 = MessageBuilder::operator<<
                               ((MessageBuilder *)&thresholdRed,
                                (char (*) [28])"Found an invalid pixel at (");
            pMVar6 = MessageBuilder::operator<<(pMVar6,&stack0xfffffffffffff940);
            pMVar6 = MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2c6b075);
            pMVar6 = MessageBuilder::operator<<(pMVar6,(int *)&color);
            pMVar6 = MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2c2d560);
            pMVar6 = MessageBuilder::operator<<(pMVar6,(char (*) [16])"\tPixel color:\t\t");
            pMVar6 = MessageBuilder::operator<<(pMVar6,(RGBA *)&stackSize);
            pMVar6 = MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2b9e07b);
            pMVar6 = MessageBuilder::operator<<
                               (pMVar6,(char (*) [29])"\tExpected background color.\n");
            MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&TestLog::EndMessage);
            MessageBuilder::~MessageBuilder((MessageBuilder *)&thresholdRed);
          }
          errorMask.m_pixels.m_cap._4_4_ = errorMask.m_pixels.m_cap._4_4_ + 1;
          Surface::setPixel((Surface *)local_70,iStack_6c0,color.m_value,
                            (RGBA)viewportSize.m_data[1]);
        }
      }
      else {
        iVar2 = local_6cc + -1;
        valueRangeMin.m_data[2] = (float)(local_6cc + -1);
        valueRangeMin.m_data[1] = (float)(local_6cc + -1);
        Vector<float,_4>::xyz
                  ((VecAccess<float,_4,_3> *)(valueRangeMax.m_data + 1),
                   (Vector<float,_4> *)(colorStackMax.m_data + 2));
        VecAccess::operator_cast_to_Vector((VecAccess *)local_9ac);
        Vector<float,_4>::xyz
                  ((VecAccess<float,_4,_3> *)(formatLimit.m_data + 1),(Vector<float,_4> *)&coverage)
        ;
        VecAccess::operator_cast_to_Vector((VecAccess *)local_9d4);
        Vector<int,_3>::Vector
                  ((Vector<int,_3> *)(colorMinF.m_data + 1),(1 << ((byte)args->redBits & 0x1f)) + -1
                   ,(1 << ((byte)args->greenBits & 0x1f)) + -1,
                   (1 << ((byte)args->blueBits & 0x1f)) + -1);
        fVar13 = Vector<float,_3>::x((Vector<float,_3> *)local_9ac);
        iVar3 = Vector<int,_3>::x((Vector<int,_3> *)(colorMinF.m_data + 1));
        iVar5 = Vector<int,_3>::x((Vector<int,_3> *)(colorMinF.m_data + 1));
        fVar13 = de::clamp<float>(fVar13 * (float)iVar3,0.0,(float)iVar5);
        fVar14 = Vector<float,_3>::y((Vector<float,_3> *)local_9ac);
        iVar3 = Vector<int,_3>::y((Vector<int,_3> *)(colorMinF.m_data + 1));
        iVar5 = Vector<int,_3>::y((Vector<int,_3> *)(colorMinF.m_data + 1));
        fVar14 = de::clamp<float>(fVar14 * (float)iVar3,0.0,(float)iVar5);
        fVar15 = Vector<float,_3>::z((Vector<float,_3> *)local_9ac);
        iVar3 = Vector<int,_3>::z((Vector<int,_3> *)(colorMinF.m_data + 1));
        iVar5 = Vector<int,_3>::z((Vector<int,_3> *)(colorMinF.m_data + 1));
        fVar15 = de::clamp<float>(fVar15 * (float)iVar3,0.0,(float)iVar5);
        Vector<float,_3>::Vector((Vector<float,_3> *)(colorMaxF.m_data + 1),fVar13,fVar14,fVar15);
        fVar13 = Vector<float,_3>::x((Vector<float,_3> *)local_9d4);
        iVar3 = Vector<int,_3>::x((Vector<int,_3> *)(colorMinF.m_data + 1));
        iVar5 = Vector<int,_3>::x((Vector<int,_3> *)(colorMinF.m_data + 1));
        fVar13 = de::clamp<float>(fVar13 * (float)iVar3,0.0,(float)iVar5);
        fVar14 = Vector<float,_3>::y((Vector<float,_3> *)local_9d4);
        iVar3 = Vector<int,_3>::y((Vector<int,_3> *)(colorMinF.m_data + 1));
        iVar5 = Vector<int,_3>::y((Vector<int,_3> *)(colorMinF.m_data + 1));
        fVar14 = de::clamp<float>(fVar14 * (float)iVar3,0.0,(float)iVar5);
        fVar15 = Vector<float,_3>::z((Vector<float,_3> *)local_9d4);
        iVar3 = Vector<int,_3>::z((Vector<int,_3> *)(colorMinF.m_data + 1));
        iVar5 = Vector<int,_3>::z((Vector<int,_3> *)(colorMinF.m_data + 1));
        fVar15 = de::clamp<float>(fVar15 * (float)iVar3,0.0,(float)iVar5);
        Vector<float,_3>::Vector((Vector<float,_3> *)(colorMin.m_data + 1),fVar13,fVar14,fVar15);
        fVar13 = Vector<float,_3>::x((Vector<float,_3> *)(colorMaxF.m_data + 1));
        fVar13 = ::deFloatFloor(fVar13);
        fVar14 = Vector<float,_3>::y((Vector<float,_3> *)(colorMaxF.m_data + 1));
        fVar14 = ::deFloatFloor(fVar14);
        fVar15 = Vector<float,_3>::z((Vector<float,_3> *)(colorMaxF.m_data + 1));
        fVar15 = ::deFloatFloor(fVar15);
        Vector<int,_3>::Vector
                  ((Vector<int,_3> *)(colorMax.m_data + 1),(int)fVar13,(int)fVar14,(int)fVar15);
        fVar13 = Vector<float,_3>::x((Vector<float,_3> *)(colorMin.m_data + 1));
        fVar13 = ::deFloatCeil(fVar13);
        fVar14 = Vector<float,_3>::y((Vector<float,_3> *)(colorMin.m_data + 1));
        fVar14 = ::deFloatCeil(fVar14);
        fVar15 = Vector<float,_3>::z((Vector<float,_3> *)(colorMin.m_data + 1));
        fVar15 = ::deFloatCeil(fVar15);
        Vector<int,_3>::Vector
                  ((Vector<int,_3> *)(pixelNativeColor_1.m_data + 1),(int)fVar13,(int)fVar14,
                   (int)fVar15);
        convertRGB8ToNativeFormat((anon_unknown_3 *)local_a38,(RGBA *)&stackSize,args);
        iVar3 = Vector<int,_3>::x((Vector<int,_3> *)local_a38);
        iVar5 = Vector<int,_3>::x((Vector<int,_3> *)(colorMax.m_data + 1));
        if (iVar5 - iVar2 <= iVar3) {
          iVar3 = Vector<int,_3>::y((Vector<int,_3> *)local_a38);
          iVar5 = Vector<int,_3>::y((Vector<int,_3> *)(colorMax.m_data + 1));
          if (iVar5 - (int)valueRangeMin.m_data[2] <= iVar3) {
            iVar3 = Vector<int,_3>::z((Vector<int,_3> *)local_a38);
            iVar5 = Vector<int,_3>::z((Vector<int,_3> *)(colorMax.m_data + 1));
            if (iVar5 - (int)valueRangeMin.m_data[1] <= iVar3) {
              iVar3 = Vector<int,_3>::x((Vector<int,_3> *)local_a38);
              iVar5 = Vector<int,_3>::x((Vector<int,_3> *)(pixelNativeColor_1.m_data + 1));
              if (iVar3 <= iVar5 + iVar2) {
                iVar3 = Vector<int,_3>::y((Vector<int,_3> *)local_a38);
                iVar5 = Vector<int,_3>::y((Vector<int,_3> *)(pixelNativeColor_1.m_data + 1));
                if (iVar3 <= iVar5 + (int)valueRangeMin.m_data[2]) {
                  iVar3 = Vector<int,_3>::z((Vector<int,_3> *)local_a38);
                  iVar5 = Vector<int,_3>::z((Vector<int,_3> *)(pixelNativeColor_1.m_data + 1));
                  if (iVar3 <= iVar5 + (int)valueRangeMin.m_data[1]) goto LAB_02980d9b;
                }
              }
            }
          }
        }
        subPixelBits = subPixelBits + 1;
        if (subPixelBits < 5) {
          TestLog::operator<<(&local_bb8,log,(BeginMessageToken *)&TestLog::Message);
          pMVar6 = MessageBuilder::operator<<
                             (&local_bb8,(char (*) [28])"Found an invalid pixel at (");
          pMVar6 = MessageBuilder::operator<<(pMVar6,&stack0xfffffffffffff940);
          pMVar6 = MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2c6b075);
          pMVar6 = MessageBuilder::operator<<(pMVar6,(int *)&color);
          pMVar6 = MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2c2d560);
          pMVar6 = MessageBuilder::operator<<(pMVar6,(char (*) [16])"\tPixel color:\t\t");
          pMVar6 = MessageBuilder::operator<<(pMVar6,(RGBA *)&stackSize);
          pMVar6 = MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2b9e07b);
          pMVar6 = MessageBuilder::operator<<(pMVar6,(char (*) [17])"\tNative color:\t\t");
          pMVar6 = MessageBuilder::operator<<(pMVar6,(Vector<int,_3> *)local_a38);
          pMVar6 = MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2b9e07b);
          pMVar6 = MessageBuilder::operator<<(pMVar6,(char (*) [18])"\tAllowed error:\t\t");
          Vector<int,_3>::Vector
                    (&local_bc4,iVar2,(int)valueRangeMin.m_data[2],(int)valueRangeMin.m_data[1]);
          pMVar6 = MessageBuilder::operator<<(pMVar6,&local_bc4);
          pMVar6 = MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2b9e07b);
          pMVar6 = MessageBuilder::operator<<(pMVar6,(char (*) [30])0x2c87900);
          Vector<int,_3>::Vector
                    (&local_be8,iVar2,(int)valueRangeMin.m_data[2],(int)valueRangeMin.m_data[1]);
          tcu::operator-((tcu *)&local_bdc,(Vector<int,_3> *)(colorMax.m_data + 1),&local_be8);
          Vector<int,_3>::Vector(&local_bf4,0,0,0);
          clamp<int,3>((tcu *)&local_bd0,&local_bdc,&local_bf4,
                       (Vector<int,_3> *)(colorMinF.m_data + 1));
          pMVar6 = MessageBuilder::operator<<(pMVar6,&local_bd0);
          pMVar6 = MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2b9e07b);
          pMVar6 = MessageBuilder::operator<<(pMVar6,(char (*) [30])0x2c87920);
          Vector<int,_3>::Vector
                    (&local_c18,iVar2,(int)valueRangeMin.m_data[2],(int)valueRangeMin.m_data[1]);
          tcu::operator+((tcu *)&local_c0c,(Vector<int,_3> *)(pixelNativeColor_1.m_data + 1),
                         &local_c18);
          Vector<int,_3>::Vector(&local_c24,0,0,0);
          clamp<int,3>((tcu *)&local_c00,&local_c0c,&local_c24,
                       (Vector<int,_3> *)(colorMinF.m_data + 1));
          pMVar6 = MessageBuilder::operator<<(pMVar6,&local_c00);
          pMVar6 = MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2b9e07b);
          pMVar6 = MessageBuilder::operator<<(pMVar6,(char (*) [30])0x2c87940);
          Vector<int,_3>::Vector
                    (&local_c54,iVar2,(int)valueRangeMin.m_data[2],(int)valueRangeMin.m_data[1]);
          Vector<int,_3>::cast<float>((Vector<int,_3> *)&local_c48);
          tcu::operator-((tcu *)&local_c3c,(Vector<float,_3> *)(colorMaxF.m_data + 1),&local_c48);
          Vector<float,_3>::Vector(&local_c60,0.0,0.0,0.0);
          Vector<int,_3>::cast<float>((Vector<int,_3> *)&local_c6c);
          clamp<float,3>((tcu *)&local_c30,&local_c3c,&local_c60,&local_c6c);
          pMVar6 = MessageBuilder::operator<<(pMVar6,&local_c30);
          pMVar6 = MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2b9e07b);
          pMVar6 = MessageBuilder::operator<<(pMVar6,(char (*) [30])0x2c87960);
          Vector<int,_3>::Vector
                    (&local_c9c,iVar2,(int)valueRangeMin.m_data[2],(int)valueRangeMin.m_data[1]);
          Vector<int,_3>::cast<float>((Vector<int,_3> *)&local_c90);
          tcu::operator+((tcu *)&local_c84,(Vector<float,_3> *)(colorMin.m_data + 1),&local_c90);
          Vector<float,_3>::Vector(&local_ca8,0.0,0.0,0.0);
          Vector<int,_3>::cast<float>((Vector<int,_3> *)&local_cb4);
          clamp<float,3>((tcu *)&local_c78,&local_c84,&local_ca8,&local_cb4);
          pMVar6 = MessageBuilder::operator<<(pMVar6,&local_c78);
          pMVar6 = MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2b9e07b);
          pMVar6 = MessageBuilder::operator<<(pMVar6,(char (*) [8])0x2c87980);
          Vector<float,_3>::Vector(&local_ccc,0.0,0.0,0.0);
          Vector<float,_3>::Vector(&local_cd8,1.0,1.0,1.0);
          clamp<float,3>((tcu *)&local_cc0,(Vector<float,_3> *)local_9ac,&local_ccc,&local_cd8);
          pMVar6 = MessageBuilder::operator<<(pMVar6,&local_cc0);
          pMVar6 = MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2b9e07b);
          pMVar6 = MessageBuilder::operator<<(pMVar6,(char (*) [8])0x2c8798a);
          Vector<float,_3>::Vector(&local_cf0,0.0,0.0,0.0);
          Vector<float,_3>::Vector(&local_cfc,1.0,1.0,1.0);
          clamp<float,3>((tcu *)&local_ce4,(Vector<float,_3> *)local_9d4,&local_cf0,&local_cfc);
          pMVar6 = MessageBuilder::operator<<(pMVar6,&local_ce4);
          pMVar6 = MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2b9e07b);
          MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&TestLog::EndMessage);
          MessageBuilder::~MessageBuilder(&local_bb8);
        }
        errorMask.m_pixels.m_cap._4_4_ = errorMask.m_pixels.m_cap._4_4_ + 1;
        local_d00 = viewportSize.m_data[1];
        Surface::setPixel((Surface *)local_70,iStack_6c0,color.m_value,(RGBA)viewportSize.m_data[1])
        ;
      }
LAB_02980d9b:
    }
    color.m_value = color.m_value + 1;
  } while( true );
}

Assistant:

bool verifyTriangleGroupInterpolationWithInterpolator (const tcu::Surface& surface, const TriangleSceneSpec& scene, const RasterizationArguments& args, tcu::TestLog& log, const Interpolator& interpolator)
{
	const tcu::RGBA		invalidPixelColor	= tcu::RGBA(255, 0, 0, 255);
	const bool			multisampled		= (args.numSamples != 0);
	const tcu::IVec2	viewportSize		= tcu::IVec2(surface.getWidth(), surface.getHeight());
	const int			errorFloodThreshold	= 4;
	int					errorCount			= 0;
	int					invalidPixels		= 0;
	int					subPixelBits		= args.subpixelBits;
	tcu::Surface		errorMask			(surface.getWidth(), surface.getHeight());

	tcu::clear(errorMask.getAccess(), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));

	// log format

	log << tcu::TestLog::Message << "Verifying rasterization result. Native format is RGB" << args.redBits << args.greenBits << args.blueBits << tcu::TestLog::EndMessage;
	if (args.redBits > 8 || args.greenBits > 8 || args.blueBits > 8)
		log << tcu::TestLog::Message << "Warning! More than 8 bits in a color channel, this may produce false negatives." << tcu::TestLog::EndMessage;

	// subpixel bits in in a valid range?

	if (subPixelBits < 0)
	{
		log << tcu::TestLog::Message << "Invalid subpixel count (" << subPixelBits << "), assuming 0" << tcu::TestLog::EndMessage;
		subPixelBits = 0;
	}
	else if (subPixelBits > 16)
	{
		// At high subpixel bit counts we might overflow. Checking at lower bit count is ok, but is less strict
		log << tcu::TestLog::Message << "Subpixel count is greater than 16 (" << subPixelBits << "). Checking results using less strict 16 bit requirements. This may produce false positives." << tcu::TestLog::EndMessage;
		subPixelBits = 16;
	}

	// check pixels

	for (int y = 0; y < surface.getHeight(); ++y)
	for (int x = 0; x < surface.getWidth();  ++x)
	{
		const tcu::RGBA		color				= surface.getPixel(x, y);
		bool				stackBottomFound	= false;
		int					stackSize			= 0;
		tcu::Vec4			colorStackMin;
		tcu::Vec4			colorStackMax;

		// Iterate triangle coverage front to back, find the stack of pontentially contributing fragments
		for (int triNdx = (int)scene.triangles.size() - 1; triNdx >= 0; --triNdx)
		{
			const CoverageType coverage = calculateTriangleCoverage(scene.triangles[triNdx].positions[0],
																	scene.triangles[triNdx].positions[1],
																	scene.triangles[triNdx].positions[2],
																	tcu::IVec2(x, y),
																	viewportSize,
																	subPixelBits,
																	multisampled);

			if (coverage == COVERAGE_FULL || coverage == COVERAGE_PARTIAL)
			{
				// potentially contributes to the result fragment's value
				const InterpolationRange weights = interpolator.interpolate(triNdx, tcu::IVec2(x, y), viewportSize, multisampled, subPixelBits);

				const tcu::Vec4 fragmentColorMax =	de::clamp(weights.max.x(), 0.0f, 1.0f) * scene.triangles[triNdx].colors[0] +
													de::clamp(weights.max.y(), 0.0f, 1.0f) * scene.triangles[triNdx].colors[1] +
													de::clamp(weights.max.z(), 0.0f, 1.0f) * scene.triangles[triNdx].colors[2];
				const tcu::Vec4 fragmentColorMin =	de::clamp(weights.min.x(), 0.0f, 1.0f) * scene.triangles[triNdx].colors[0] +
													de::clamp(weights.min.y(), 0.0f, 1.0f) * scene.triangles[triNdx].colors[1] +
													de::clamp(weights.min.z(), 0.0f, 1.0f) * scene.triangles[triNdx].colors[2];

				if (stackSize++ == 0)
				{
					// first triangle, set the values properly
					colorStackMin = fragmentColorMin;
					colorStackMax = fragmentColorMax;
				}
				else
				{
					// contributing triangle
					colorStackMin = tcu::min(colorStackMin, fragmentColorMin);
					colorStackMax = tcu::max(colorStackMax, fragmentColorMax);
				}

				if (coverage == COVERAGE_FULL)
				{
					// loop terminates, this is the bottommost fragment
					stackBottomFound = true;
					break;
				}
			}
		}

		// Partial coverage == background may be visible
		if (stackSize != 0 && !stackBottomFound)
		{
			stackSize++;
			colorStackMin = tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f);
		}

		// Is the result image color in the valid range.
		if (stackSize == 0)
		{
			// No coverage, allow only background (black, value=0)
			const tcu::IVec3	pixelNativeColor	= convertRGB8ToNativeFormat(color, args);
			const int			threshold			= 1;

			if (pixelNativeColor.x() > threshold ||
				pixelNativeColor.y() > threshold ||
				pixelNativeColor.z() > threshold)
			{
				++errorCount;

				// don't fill the logs with too much data
				if (errorCount < errorFloodThreshold)
				{
					log << tcu::TestLog::Message
						<< "Found an invalid pixel at (" << x << "," << y << ")\n"
						<< "\tPixel color:\t\t" << color << "\n"
						<< "\tExpected background color.\n"
						<< tcu::TestLog::EndMessage;
				}

				++invalidPixels;
				errorMask.setPixel(x, y, invalidPixelColor);
			}
		}
		else
		{
			DE_ASSERT(stackSize);

			// Each additional step in the stack may cause conversion error of 1 bit due to undefined rounding direction
			const int			thresholdRed	= stackSize - 1;
			const int			thresholdGreen	= stackSize - 1;
			const int			thresholdBlue	= stackSize - 1;

			const tcu::Vec3		valueRangeMin	= tcu::Vec3(colorStackMin.xyz());
			const tcu::Vec3		valueRangeMax	= tcu::Vec3(colorStackMax.xyz());

			const tcu::IVec3	formatLimit		((1 << args.redBits) - 1, (1 << args.greenBits) - 1, (1 << args.blueBits) - 1);
			const tcu::Vec3		colorMinF		(de::clamp(valueRangeMin.x() * (float)formatLimit.x(), 0.0f, (float)formatLimit.x()),
												 de::clamp(valueRangeMin.y() * (float)formatLimit.y(), 0.0f, (float)formatLimit.y()),
												 de::clamp(valueRangeMin.z() * (float)formatLimit.z(), 0.0f, (float)formatLimit.z()));
			const tcu::Vec3		colorMaxF		(de::clamp(valueRangeMax.x() * (float)formatLimit.x(), 0.0f, (float)formatLimit.x()),
												 de::clamp(valueRangeMax.y() * (float)formatLimit.y(), 0.0f, (float)formatLimit.y()),
												 de::clamp(valueRangeMax.z() * (float)formatLimit.z(), 0.0f, (float)formatLimit.z()));
			const tcu::IVec3	colorMin		((int)deFloatFloor(colorMinF.x()),
												 (int)deFloatFloor(colorMinF.y()),
												 (int)deFloatFloor(colorMinF.z()));
			const tcu::IVec3	colorMax		((int)deFloatCeil (colorMaxF.x()),
												 (int)deFloatCeil (colorMaxF.y()),
												 (int)deFloatCeil (colorMaxF.z()));

			// Convert pixel color from rgba8 to the real pixel format. Usually rgba8 or 565
			const tcu::IVec3 pixelNativeColor = convertRGB8ToNativeFormat(color, args);

			// Validity check
			if (pixelNativeColor.x() < colorMin.x() - thresholdRed   ||
				pixelNativeColor.y() < colorMin.y() - thresholdGreen ||
				pixelNativeColor.z() < colorMin.z() - thresholdBlue  ||
				pixelNativeColor.x() > colorMax.x() + thresholdRed   ||
				pixelNativeColor.y() > colorMax.y() + thresholdGreen ||
				pixelNativeColor.z() > colorMax.z() + thresholdBlue)
			{
				++errorCount;

				// don't fill the logs with too much data
				if (errorCount <= errorFloodThreshold)
				{
					log << tcu::TestLog::Message
						<< "Found an invalid pixel at (" << x << "," << y << ")\n"
						<< "\tPixel color:\t\t" << color << "\n"
						<< "\tNative color:\t\t" << pixelNativeColor << "\n"
						<< "\tAllowed error:\t\t" << tcu::IVec3(thresholdRed, thresholdGreen, thresholdBlue) << "\n"
						<< "\tReference native color min: " << tcu::clamp(colorMin - tcu::IVec3(thresholdRed, thresholdGreen, thresholdBlue), tcu::IVec3(0,0,0), formatLimit) << "\n"
						<< "\tReference native color max: " << tcu::clamp(colorMax + tcu::IVec3(thresholdRed, thresholdGreen, thresholdBlue), tcu::IVec3(0,0,0), formatLimit) << "\n"
						<< "\tReference native float min: " << tcu::clamp(colorMinF - tcu::IVec3(thresholdRed, thresholdGreen, thresholdBlue).cast<float>(), tcu::Vec3(0.0f, 0.0f, 0.0f), formatLimit.cast<float>()) << "\n"
						<< "\tReference native float max: " << tcu::clamp(colorMaxF + tcu::IVec3(thresholdRed, thresholdGreen, thresholdBlue).cast<float>(), tcu::Vec3(0.0f, 0.0f, 0.0f), formatLimit.cast<float>()) << "\n"
						<< "\tFmin:\t" << tcu::clamp(valueRangeMin, tcu::Vec3(0.0f, 0.0f, 0.0f), tcu::Vec3(1.0f, 1.0f, 1.0f)) << "\n"
						<< "\tFmax:\t" << tcu::clamp(valueRangeMax, tcu::Vec3(0.0f, 0.0f, 0.0f), tcu::Vec3(1.0f, 1.0f, 1.0f)) << "\n"
						<< tcu::TestLog::EndMessage;
				}

				++invalidPixels;
				errorMask.setPixel(x, y, invalidPixelColor);
			}
		}
	}

	// don't just hide failures
	if (errorCount > errorFloodThreshold)
		log << tcu::TestLog::Message << "Omitted " << (errorCount-errorFloodThreshold) << " pixel error description(s)." << tcu::TestLog::EndMessage;

	// report result
	if (invalidPixels)
	{
		log << tcu::TestLog::Message << invalidPixels << " invalid pixel(s) found." << tcu::TestLog::EndMessage;
		log << tcu::TestLog::ImageSet("Verification result", "Result of rendering")
			<< tcu::TestLog::Image("Result", "Result",			surface)
			<< tcu::TestLog::Image("ErrorMask", "ErrorMask",	errorMask)
			<< tcu::TestLog::EndImageSet;

		return false;
	}
	else
	{
		log << tcu::TestLog::Message << "No invalid pixels found." << tcu::TestLog::EndMessage;
		log << tcu::TestLog::ImageSet("Verification result", "Result of rendering")
			<< tcu::TestLog::Image("Result", "Result", surface)
			<< tcu::TestLog::EndImageSet;

		return true;
	}
}